

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::trivialHeuristic(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  Real RVar3;
  bool bVar4;
  bool bVar5;
  type_conflict5 tVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  ulong uVar15;
  Item *pIVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  pointer pnVar18;
  uint *puVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  pointer pnVar24;
  int32_t iVar25;
  fpclass_type fVar26;
  uint uVar27;
  byte bVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  undefined1 local_f10 [112];
  int local_ea0;
  bool local_e9c;
  fpclass_type local_e98;
  int32_t iStack_e94;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  locksol;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  double local_de8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  uppersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  lowersol;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  zerosol;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_d98;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_d80;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_d68;
  _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  local_d50;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  cpp_dec_float<200U,_int,_void> local_cb8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_938;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lockObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  upperObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowerObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  zeroObj;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  cpp_dec_float<200U,_int,_void> local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  cpp_dec_float<200U,_int,_void> local_430;
  cpp_dec_float<200U,_int,_void> local_3b0;
  cpp_dec_float<200U,_int,_void> local_330;
  cpp_dec_float<200U,_int,_void> local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  cpp_dec_float<200U,_int,_void> local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar28 = 0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&zerosol,(lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&lowersol,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&uppersol,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&locksol,(lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&upLocks,(lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&downLocks,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  pnVar21 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_objoffset;
  lVar10 = 0x1c;
  pnVar17 = pnVar21;
  pnVar22 = &zeroObj;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + (ulong)bVar28 * -8 + 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
  }
  iVar7 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_objoffset.m_backend.exp;
  bVar4 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_objoffset.m_backend.neg;
  fVar26 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_objoffset.m_backend.fpclass;
  iVar25 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_objoffset.m_backend.prec_elem;
  pnVar17 = pnVar21;
  pnVar22 = &lowerObj;
  zeroObj.m_backend.exp = iVar7;
  zeroObj.m_backend.neg = bVar4;
  zeroObj.m_backend.fpclass = fVar26;
  zeroObj.m_backend.prec_elem = iVar25;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + (ulong)bVar28 * -8 + 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
  }
  pnVar17 = pnVar21;
  pnVar22 = &upperObj;
  lowerObj.m_backend.exp = iVar7;
  lowerObj.m_backend.neg = bVar4;
  lowerObj.m_backend.fpclass = fVar26;
  lowerObj.m_backend.prec_elem = iVar25;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar22->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + (ulong)bVar28 * -8 + 4);
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar22 + ((ulong)bVar28 * -2 + 1) * 4);
  }
  pnVar17 = &lockObj;
  upperObj.m_backend.exp = iVar7;
  upperObj.m_backend.neg = bVar4;
  upperObj.m_backend.fpclass = fVar26;
  upperObj.m_backend.prec_elem = iVar25;
  for (; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar17->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
    pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar21 + (ulong)bVar28 * -8 + 4);
    pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar17 + ((ulong)bVar28 * -2 + 1) * 4);
  }
  lockObj.m_backend.exp = iVar7;
  lockObj.m_backend.neg = bVar4;
  lockObj.m_backend.fpclass = fVar26;
  lockObj.m_backend.prec_elem = iVar25;
  pdVar8 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_cb8,*pdVar8,(type *)0x0);
  result_3.m_backend.data._M_elems[0] = 0;
  result_3.m_backend.data._M_elems[1] = 0x3ff00000;
  feastol(&result_1,this);
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 0x1c;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems[6] = 0;
  result.m_backend.data._M_elems[7] = 0;
  result.m_backend.data._M_elems[8] = 0;
  result.m_backend.data._M_elems[9] = 0;
  result.m_backend.data._M_elems[10] = 0;
  result.m_backend.data._M_elems[0xb] = 0;
  result.m_backend.data._M_elems[0xc] = 0;
  result.m_backend.data._M_elems[0xd] = 0;
  result.m_backend.data._M_elems[0xe] = 0;
  result.m_backend.data._M_elems[0xf] = 0;
  result.m_backend.data._M_elems[0x10] = 0;
  result.m_backend.data._M_elems[0x11] = 0;
  result.m_backend.data._M_elems[0x12] = 0;
  result.m_backend.data._M_elems[0x13] = 0;
  result.m_backend.data._M_elems[0x14] = 0;
  result.m_backend.data._M_elems[0x15] = 0;
  result.m_backend.data._M_elems[0x16] = 0;
  result.m_backend.data._M_elems[0x17] = 0;
  result.m_backend.data._M_elems[0x18] = 0;
  result.m_backend.data._M_elems[0x19] = 0;
  result.m_backend.data._M_elems._104_5_ = 0;
  result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&result.m_backend,(double *)&result_3,&result_1.m_backend);
  pdVar8 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&local_b0,*pdVar8,(type *)0x0);
  psVar1 = &(this->
            super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_f10,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  RVar3 = Tolerances::epsilon((Tolerances *)CONCAT44(local_f10._4_4_,local_f10._0_4_));
  bVar4 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&result,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_b0,RVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f10 + 8));
  if (bVar4) {
    result_3.m_backend.data._M_elems[0] = 0;
    result_3.m_backend.data._M_elems[1] = 0x3ff00000;
    feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_f10,this);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&result_1.m_backend,(double *)&result_3,(cpp_dec_float<200U,_int,_void> *)local_f10);
    pnVar21 = &result_1;
    pcVar14 = &local_cb8;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar14->data)._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar28 * -2 + 1) * 4);
    }
    local_cb8.exp = result_1.m_backend.exp;
    local_cb8.neg = result_1.m_backend.neg;
    local_cb8.fpclass = result_1.m_backend.fpclass;
    local_cb8.prec_elem = result_1.m_backend.prec_elem;
  }
  uVar15 = (ulong)(uint)(lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .set.thenum;
  bVar4 = true;
  do {
    if ((int)uVar15 < 1) {
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_d50,&lowersol.val);
      bVar5 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&local_d50);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_d50);
      if (bVar5) {
        tVar6 = boost::multiprecision::operator>(&lowerObj,&this->m_cutoffbound);
        if (tVar6) {
          pnVar21 = &lowerObj;
          pnVar17 = &this->m_cutoffbound;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + (ulong)bVar28 * -8 + 4);
          }
          (this->m_cutoffbound).m_backend.exp = lowerObj.m_backend.exp;
          (this->m_cutoffbound).m_backend.neg = lowerObj.m_backend.neg;
          (this->m_cutoffbound).m_backend.fpclass = lowerObj.m_backend.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = lowerObj.m_backend.prec_elem;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_d68,&uppersol.val);
      bVar5 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&local_d68);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_d68);
      if (bVar5) {
        tVar6 = boost::multiprecision::operator>(&upperObj,&this->m_cutoffbound);
        if (tVar6) {
          pnVar21 = &upperObj;
          pnVar17 = &this->m_cutoffbound;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + (ulong)bVar28 * -8 + 4);
          }
          (this->m_cutoffbound).m_backend.exp = upperObj.m_backend.exp;
          (this->m_cutoffbound).m_backend.neg = upperObj.m_backend.neg;
          (this->m_cutoffbound).m_backend.fpclass = upperObj.m_backend.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = upperObj.m_backend.prec_elem;
        }
      }
      if (bVar4) {
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  *)&local_d80,&zerosol.val);
        bVar4 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)&local_d80);
        std::
        _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::~_Vector_base(&local_d80);
        if (bVar4) {
          tVar6 = boost::multiprecision::operator>(&zeroObj,&this->m_cutoffbound);
          if (tVar6) {
            pnVar21 = &zeroObj;
            pnVar17 = &this->m_cutoffbound;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar17->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
              pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
              pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar17 + (ulong)bVar28 * -8 + 4);
            }
            (this->m_cutoffbound).m_backend.exp = zeroObj.m_backend.exp;
            (this->m_cutoffbound).m_backend.neg = zeroObj.m_backend.neg;
            (this->m_cutoffbound).m_backend.fpclass = zeroObj.m_backend.fpclass;
            (this->m_cutoffbound).m_backend.prec_elem = zeroObj.m_backend.prec_elem;
          }
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                *)&local_d98,&locksol.val);
      bVar4 = checkSolution(this,lp,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&local_d98);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base(&local_d98);
      if (bVar4) {
        tVar6 = boost::multiprecision::operator>(&lockObj,&this->m_cutoffbound);
        if (tVar6) {
          pnVar21 = &lockObj;
          pnVar17 = &this->m_cutoffbound;
          for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + (ulong)bVar28 * -8 + 4);
          }
          (this->m_cutoffbound).m_backend.exp = lockObj.m_backend.exp;
          (this->m_cutoffbound).m_backend.neg = lockObj.m_backend.neg;
          (this->m_cutoffbound).m_backend.fpclass = lockObj.m_backend.fpclass;
          (this->m_cutoffbound).m_backend.prec_elem = lockObj.m_backend.prec_elem;
        }
      }
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&downLocks);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&upLocks);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&locksol);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&uppersol);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&lowersol);
      std::
      _Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::~_Vector_base((_Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       *)&zerosol);
      return;
    }
    uVar15 = uVar15 - 1;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&upLocks.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend,0);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&downLocks.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend,0);
    pIVar16 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[uVar15].idx;
    lVar10 = 0;
    for (lVar9 = 0;
        lVar9 < (pIVar16->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused; lVar9 = lVar9 + 1) {
      pNVar2 = (pIVar16->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      lVar12 = 0x1c;
      puVar19 = (uint *)((long)&(pNVar2->val).m_backend.data + lVar10);
      pnVar21 = &result_1;
      for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar21->m_backend).data._M_elems[0] = *puVar19;
        puVar19 = puVar19 + (ulong)bVar28 * -2 + 1;
        pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      result_1.m_backend.exp = *(int *)((long)&(pNVar2->val).m_backend.data + lVar10 + 0x70);
      result_1.m_backend.neg = *(bool *)((long)&(pNVar2->val).m_backend.data + lVar10 + 0x74);
      result_1.m_backend._120_8_ =
           *(undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar10 + 0x78);
      iVar7 = *(int *)((long)(&((pIVar16->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val + 1) + lVar10);
      pnVar24 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar18 = pnVar24 + iVar7;
      pnVar21 = &local_8b8;
      for (; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
        pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      local_8b8.m_backend.exp = pnVar24[iVar7].m_backend.exp;
      local_8b8.m_backend.neg = pnVar24[iVar7].m_backend.neg;
      local_8b8.m_backend.fpclass = pnVar24[iVar7].m_backend.fpclass;
      local_8b8.m_backend.prec_elem = pnVar24[iVar7].m_backend.prec_elem;
      pdVar8 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_130,-*pdVar8,(type *)0x0);
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_f10,
                 &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      RVar3 = Tolerances::epsilon((Tolerances *)CONCAT44(local_f10._4_4_,local_f10._0_4_));
      bVar5 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_8b8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_130,RVar3);
      if (bVar5) {
        iVar7 = *(int *)((long)(&((pIVar16->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar10);
        pnVar24 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar18 = pnVar24 + iVar7;
        pnVar21 = &local_938;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        local_938.m_backend.exp = pnVar24[iVar7].m_backend.exp;
        local_938.m_backend.neg = pnVar24[iVar7].m_backend.neg;
        local_938.m_backend.fpclass = pnVar24[iVar7].m_backend.fpclass;
        local_938.m_backend.prec_elem = pnVar24[iVar7].m_backend.prec_elem;
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_1b0,*pdVar8,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_3,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar3 = Tolerances::epsilon((Tolerances *)result_3.m_backend.data._M_elems._0_8_);
        bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_938,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1b0,RVar3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   (result_3.m_backend.data._M_elems + 2));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f10 + 8));
        if (!bVar5) goto LAB_004117e6;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f10,
                     upLocks.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar15,0);
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_f10,
                     downLocks.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar15,0);
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f10 + 8));
LAB_004117e6:
        iVar7 = *(int *)((long)(&((pIVar16->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val + 1) + lVar10);
        pnVar24 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar18 = pnVar24 + iVar7;
        pnVar21 = &local_9b8;
        for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        local_9b8.m_backend.exp = pnVar24[iVar7].m_backend.exp;
        local_9b8.m_backend.neg = pnVar24[iVar7].m_backend.neg;
        local_9b8.m_backend.fpclass = pnVar24[iVar7].m_backend.fpclass;
        local_9b8.m_backend.prec_elem = pnVar24[iVar7].m_backend.prec_elem;
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_230,-*pdVar8,(type *)0x0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_f10,
                   &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar3 = Tolerances::epsilon((Tolerances *)CONCAT44(local_f10._4_4_,local_f10._0_4_));
        bVar5 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_9b8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_230,RVar3);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f10 + 8));
        if (bVar5) {
          local_f10._0_4_ = 0;
          tVar6 = boost::multiprecision::operator>(&result_1,(int *)local_f10);
          if (tVar6) {
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_f10,
                         downLocks.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar15,0);
          }
          else {
            local_f10._0_4_ = 0;
            tVar6 = boost::multiprecision::operator<(&result_1,(int *)local_f10);
            if (tVar6) {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_f10,
                           upLocks.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar15,0);
            }
          }
        }
        else {
          iVar7 = *(int *)((long)(&((pIVar16->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar10);
          pnVar24 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar18 = pnVar24 + iVar7;
          pnVar21 = &local_a38;
          for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
            (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
            pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
            pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
          }
          local_a38.m_backend.exp = pnVar24[iVar7].m_backend.exp;
          local_a38.m_backend.neg = pnVar24[iVar7].m_backend.neg;
          local_a38.m_backend.fpclass = pnVar24[iVar7].m_backend.fpclass;
          local_a38.m_backend.prec_elem = pnVar24[iVar7].m_backend.prec_elem;
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&local_2b0,*pdVar8,(type *)0x0);
          std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_f10,
                     &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
          RVar3 = Tolerances::epsilon((Tolerances *)CONCAT44(local_f10._4_4_,local_f10._0_4_));
          bVar5 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (&local_a38,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_2b0,RVar3);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f10 + 8));
          if (bVar5) {
            local_f10._0_4_ = 0;
            tVar6 = boost::multiprecision::operator>(&result_1,(int *)local_f10);
            if (tVar6) {
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_f10,
                           upLocks.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar15,0);
            }
            else {
              local_f10._0_4_ = 0;
              tVar6 = boost::multiprecision::operator<(&result_1,(int *)local_f10);
              if (tVar6) {
                boost::multiprecision::
                number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                ::operator++((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_f10,
                             downLocks.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar15,0);
              }
            }
          }
        }
      }
      lVar10 = lVar10 + 0x84;
    }
    pnVar24 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0x1c;
    pnVar18 = pnVar24 + uVar15;
    pnVar21 = &result_1;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
    }
    iVar7 = pnVar24[uVar15].m_backend.exp;
    result_1.m_backend.exp = iVar7;
    bVar5 = pnVar24[uVar15].m_backend.neg;
    result_1.m_backend.neg = bVar5;
    fVar26 = pnVar24[uVar15].m_backend.fpclass;
    iVar25 = pnVar24[uVar15].m_backend.prec_elem;
    result_1.m_backend.prec_elem = iVar25;
    result_1.m_backend.fpclass = fVar26;
    pnVar24 = (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar18 = pnVar24 + uVar15;
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_f10;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar14->data)._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar28 * -2 + 1) * 4);
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar28 * -8 + 4);
    }
    local_ea0 = pnVar24[uVar15].m_backend.exp;
    local_e9c = pnVar24[uVar15].m_backend.neg;
    local_e98 = pnVar24[uVar15].m_backend.fpclass;
    iStack_e94 = pnVar24[uVar15].m_backend.prec_elem;
    pnVar21 = &result_1;
    pnVar17 = &local_ab8;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar28 * -2 + 1) * 4);
    }
    local_ab8.m_backend.exp = iVar7;
    local_ab8.m_backend.neg = bVar5;
    local_ab8.m_backend.fpclass = fVar26;
    local_ab8.m_backend.prec_elem = iVar25;
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_330,-*pdVar8,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_3.m_backend,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar3 = Tolerances::epsilon((Tolerances *)result_3.m_backend.data._M_elems._0_8_);
    bVar5 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_ab8,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_330,RVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result_3.m_backend.data._M_elems + 2))
    ;
    if (bVar5) {
      pcVar14 = &local_cb8;
      pcVar20 = &result_3.m_backend;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar20->data)._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + ((ulong)bVar28 * -2 + 1) * 4);
        pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar28 * -8 + 4);
      }
      result_3.m_backend.exp = local_cb8.exp;
      result_3.m_backend.neg = local_cb8.neg;
      result_3.m_backend.fpclass = local_cb8.fpclass;
      result_3.m_backend.prec_elem = local_cb8.prec_elem;
      if (local_cb8.fpclass != cpp_dec_float_finite || result_3.m_backend.data._M_elems[0] != 0) {
        result_3.m_backend.neg = (bool)(local_cb8.neg ^ 1);
      }
      tVar6 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_3.m_backend,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)local_f10);
      uVar27 = local_cb8.data._M_elems[0];
      if (tVar6) {
        puVar19 = local_cb8.data._M_elems + 1;
        pnVar21 = &result_2;
        for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar28 * -2 + 1;
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        iVar7 = local_cb8.exp;
        iVar25 = local_cb8.prec_elem;
        if (local_cb8.fpclass == cpp_dec_float_finite && uVar27 == 0) {
          fVar26 = cpp_dec_float_finite;
          bVar13 = local_cb8.neg;
          uVar27 = 0;
        }
        else {
          bVar13 = local_cb8.neg ^ 1;
          fVar26 = local_cb8.fpclass;
        }
      }
      else {
        puVar19 = (uint *)(local_f10 + 4);
        pnVar21 = &result_2;
        for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = *puVar19;
          puVar19 = puVar19 + (ulong)bVar28 * -2 + 1;
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        iVar7 = local_ea0;
        bVar13 = local_e9c;
        fVar26 = local_e98;
        iVar25 = iStack_e94;
        uVar27 = local_f10._0_4_;
      }
      result_1.m_backend.data._M_elems[0] = uVar27;
      pnVar21 = &result_2;
      puVar19 = result_1.m_backend.data._M_elems + 1;
      for (lVar10 = 0x1b; lVar10 != 0; lVar10 = lVar10 + -1) {
        *puVar19 = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
        puVar19 = puVar19 + (ulong)bVar28 * -2 + 1;
      }
      result_1.m_backend.exp = iVar7;
      result_1.m_backend.neg = (bool)bVar13;
      result_1.m_backend.prec_elem = iVar25;
      result_1.m_backend.fpclass = fVar26;
    }
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_f10;
    pnVar21 = &local_b38;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar21->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar28 * -8 + 4);
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
    }
    local_b38.m_backend.exp = local_ea0;
    local_b38.m_backend.neg = local_e9c;
    local_b38.m_backend.fpclass = local_e98;
    local_b38.m_backend.prec_elem = iStack_e94;
    pdVar8 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&local_3b0,*pdVar8,(type *)0x0);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_3.m_backend,
               &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar3 = Tolerances::epsilon((Tolerances *)result_3.m_backend.data._M_elems._0_8_);
    bVar5 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_b38,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_3b0,RVar3);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result_3.m_backend.data._M_elems + 2))
    ;
    if (bVar5) {
      tVar6 = boost::multiprecision::operator>
                        ((lp->
                         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).low.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar15,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_cb8);
      pcVar14 = &(lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).low.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend;
      if (!tVar6) {
        pcVar14 = &local_cb8;
      }
      pcVar20 = pcVar14;
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)local_f10;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar23->data)._M_elems[0] = (pcVar20->data)._M_elems[0];
        pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar28 * -2 + 1) * 4);
        pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar28 * -8 + 4);
      }
      local_ea0 = pcVar14->exp;
      local_e9c = pcVar14->neg;
      local_e98 = pcVar14->fpclass;
      local_e98 = pcVar14->fpclass;
      iStack_e94 = pcVar14->prec_elem;
    }
    if (bVar4) {
      pnVar21 = &result_1;
      pnVar17 = &local_bb8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
        pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      local_bb8.m_backend.exp = result_1.m_backend.exp;
      local_bb8.m_backend.neg = result_1.m_backend.neg;
      local_bb8.m_backend.fpclass = result_1.m_backend.fpclass;
      local_bb8.m_backend.prec_elem = result_1.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_430,0.0,(type *)0x0);
      feastol(&local_4b0,this);
      bVar5 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_bb8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_430,&local_4b0);
      if (bVar5) {
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_f10;
        pnVar21 = &local_c38;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar21->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar28 * -8 + 4);
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        local_c38.m_backend.exp = local_ea0;
        local_c38.m_backend.neg = local_e9c;
        local_c38.m_backend.fpclass = local_e98;
        local_c38.m_backend.prec_elem = iStack_e94;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_530,0.0,(type *)0x0);
        feastol(&local_5b0,this);
        bVar5 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_c38,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_530,&local_5b0);
        if (bVar5) {
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)
                     (zerosol.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar15),0.0);
          goto LAB_00411eb9;
        }
      }
      bVar4 = false;
    }
LAB_00411eb9:
    lVar10 = 0x1c;
    pnVar21 = &result_1;
    pnVar24 = lowersol.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar15;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar24->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
      pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
      pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar28 * -2 + 1) * 4);
    }
    lowersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.exp = result_1.m_backend.exp;
    lowersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.neg = result_1.m_backend.neg;
    lowersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.fpclass = result_1.m_backend.fpclass
    ;
    lowersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.prec_elem =
         result_1.m_backend.prec_elem;
    pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_f10;
    pnVar24 = uppersol.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar15;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar24->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar28 * -8 + 4);
      pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar28 * -2 + 1) * 4);
    }
    uppersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.exp = local_ea0;
    uppersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.neg = local_e9c;
    uppersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.fpclass = local_e98;
    uppersol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.prec_elem = iStack_e94;
    tVar6 = boost::multiprecision::operator>
                      (downLocks.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar15,
                       upLocks.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar15);
    if (tVar6) {
      pcVar14 = (cpp_dec_float<200U,_int,_void> *)local_f10;
      pnVar24 = locksol.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar15;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
        pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar28 * -8 + 4);
        pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      locksol.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.exp = local_ea0;
      locksol.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.neg = local_e9c;
      result_3.m_backend._120_8_ = _local_e98;
    }
    else {
      tVar6 = boost::multiprecision::operator<
                        (downLocks.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar15,
                         upLocks.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar15);
      if (tVar6) {
        pnVar21 = &result_1;
        pnVar24 = locksol.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar15;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar21->m_backend).data._M_elems[0];
          pnVar21 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar21 + ((ulong)bVar28 * -2 + 1) * 4);
          pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        locksol.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.exp = result_1.m_backend.exp;
        locksol.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.neg = result_1.m_backend.neg;
        result_3.m_backend._120_8_ = result_1.m_backend._120_8_;
      }
      else {
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 0x1c;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems[6] = 0;
        result_2.m_backend.data._M_elems[7] = 0;
        result_2.m_backend.data._M_elems[8] = 0;
        result_2.m_backend.data._M_elems[9] = 0;
        result_2.m_backend.data._M_elems[10] = 0;
        result_2.m_backend.data._M_elems[0xb] = 0;
        result_2.m_backend.data._M_elems[0xc] = 0;
        result_2.m_backend.data._M_elems[0xd] = 0;
        result_2.m_backend.data._M_elems[0xe] = 0;
        result_2.m_backend.data._M_elems[0xf] = 0;
        result_2.m_backend.data._M_elems[0x10] = 0;
        result_2.m_backend.data._M_elems[0x11] = 0;
        result_2.m_backend.data._M_elems[0x12] = 0;
        result_2.m_backend.data._M_elems[0x13] = 0;
        result_2.m_backend.data._M_elems[0x14] = 0;
        result_2.m_backend.data._M_elems[0x15] = 0;
        result_2.m_backend.data._M_elems[0x16] = 0;
        result_2.m_backend.data._M_elems[0x17] = 0;
        result_2.m_backend.data._M_elems[0x18] = 0;
        result_2.m_backend.data._M_elems[0x19] = 0;
        result_2.m_backend.data._M_elems._104_5_ = 0;
        result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&result_2.m_backend,&result_1.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)local_f10);
        local_de8 = 2.0;
        result_3.m_backend.fpclass = cpp_dec_float_finite;
        result_3.m_backend.prec_elem = 0x1c;
        result_3.m_backend.data._M_elems[0] = 0;
        result_3.m_backend.data._M_elems[1] = 0;
        result_3.m_backend.data._M_elems[2] = 0;
        result_3.m_backend.data._M_elems[3] = 0;
        result_3.m_backend.data._M_elems[4] = 0;
        result_3.m_backend.data._M_elems[5] = 0;
        result_3.m_backend.data._M_elems[6] = 0;
        result_3.m_backend.data._M_elems[7] = 0;
        result_3.m_backend.data._M_elems[8] = 0;
        result_3.m_backend.data._M_elems[9] = 0;
        result_3.m_backend.data._M_elems[10] = 0;
        result_3.m_backend.data._M_elems[0xb] = 0;
        result_3.m_backend.data._M_elems[0xc] = 0;
        result_3.m_backend.data._M_elems[0xd] = 0;
        result_3.m_backend.data._M_elems[0xe] = 0;
        result_3.m_backend.data._M_elems[0xf] = 0;
        result_3.m_backend.data._M_elems[0x10] = 0;
        result_3.m_backend.data._M_elems[0x11] = 0;
        result_3.m_backend.data._M_elems[0x12] = 0;
        result_3.m_backend.data._M_elems[0x13] = 0;
        result_3.m_backend.data._M_elems[0x14] = 0;
        result_3.m_backend.data._M_elems[0x15] = 0;
        result_3.m_backend.data._M_elems[0x16] = 0;
        result_3.m_backend.data._M_elems[0x17] = 0;
        result_3.m_backend.data._M_elems[0x18] = 0;
        result_3.m_backend.data._M_elems[0x19] = 0;
        result_3.m_backend.data._M_elems._104_5_ = 0;
        result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_3.m_backend.exp = 0;
        result_3.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                  (&result_3.m_backend,&result_2.m_backend,&local_de8);
        pcVar14 = &result_3.m_backend;
        pnVar24 = locksol.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar15;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pcVar14->data)._M_elems[0];
          pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar28 * -8 + 4);
          pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar28 * -2 + 1) * 4);
        }
        locksol.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.exp = result_3.m_backend.exp;
        locksol.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.neg = result_3.m_backend.neg;
      }
    }
    locksol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.fpclass = result_3.m_backend.fpclass
    ;
    locksol.val.
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend.prec_elem =
         result_3.m_backend.prec_elem;
    result_3.m_backend.fpclass = cpp_dec_float_finite;
    result_3.m_backend.prec_elem = 0x1c;
    result_3.m_backend.data._M_elems[0] = 0;
    result_3.m_backend.data._M_elems[1] = 0;
    result_3.m_backend.data._M_elems[2] = 0;
    result_3.m_backend.data._M_elems[3] = 0;
    result_3.m_backend.data._M_elems[4] = 0;
    result_3.m_backend.data._M_elems[5] = 0;
    result_3.m_backend.data._M_elems[6] = 0;
    result_3.m_backend.data._M_elems[7] = 0;
    result_3.m_backend.data._M_elems[8] = 0;
    result_3.m_backend.data._M_elems[9] = 0;
    result_3.m_backend.data._M_elems[10] = 0;
    result_3.m_backend.data._M_elems[0xb] = 0;
    result_3.m_backend.data._M_elems[0xc] = 0;
    result_3.m_backend.data._M_elems[0xd] = 0;
    result_3.m_backend.data._M_elems[0xe] = 0;
    result_3.m_backend.data._M_elems[0xf] = 0;
    result_3.m_backend.data._M_elems[0x10] = 0;
    result_3.m_backend.data._M_elems[0x11] = 0;
    result_3.m_backend.data._M_elems[0x12] = 0;
    result_3.m_backend.data._M_elems[0x13] = 0;
    result_3.m_backend.data._M_elems[0x14] = 0;
    result_3.m_backend.data._M_elems[0x15] = 0;
    result_3.m_backend.data._M_elems[0x16] = 0;
    result_3.m_backend.data._M_elems[0x17] = 0;
    result_3.m_backend.data._M_elems[0x18] = 0;
    result_3.m_backend.data._M_elems[0x19] = 0;
    result_3.m_backend.data._M_elems._104_5_ = 0;
    result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_3.m_backend.exp = 0;
    result_3.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_3.m_backend,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend,
               &lowersol.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&lowerObj.m_backend,&result_3.m_backend);
    result_3.m_backend.fpclass = cpp_dec_float_finite;
    result_3.m_backend.prec_elem = 0x1c;
    result_3.m_backend.data._M_elems[0] = 0;
    result_3.m_backend.data._M_elems[1] = 0;
    result_3.m_backend.data._M_elems[2] = 0;
    result_3.m_backend.data._M_elems[3] = 0;
    result_3.m_backend.data._M_elems[4] = 0;
    result_3.m_backend.data._M_elems[5] = 0;
    result_3.m_backend.data._M_elems[6] = 0;
    result_3.m_backend.data._M_elems[7] = 0;
    result_3.m_backend.data._M_elems[8] = 0;
    result_3.m_backend.data._M_elems[9] = 0;
    result_3.m_backend.data._M_elems[10] = 0;
    result_3.m_backend.data._M_elems[0xb] = 0;
    result_3.m_backend.data._M_elems[0xc] = 0;
    result_3.m_backend.data._M_elems[0xd] = 0;
    result_3.m_backend.data._M_elems[0xe] = 0;
    result_3.m_backend.data._M_elems[0xf] = 0;
    result_3.m_backend.data._M_elems[0x10] = 0;
    result_3.m_backend.data._M_elems[0x11] = 0;
    result_3.m_backend.data._M_elems[0x12] = 0;
    result_3.m_backend.data._M_elems[0x13] = 0;
    result_3.m_backend.data._M_elems[0x14] = 0;
    result_3.m_backend.data._M_elems[0x15] = 0;
    result_3.m_backend.data._M_elems[0x16] = 0;
    result_3.m_backend.data._M_elems[0x17] = 0;
    result_3.m_backend.data._M_elems[0x18] = 0;
    result_3.m_backend.data._M_elems[0x19] = 0;
    result_3.m_backend.data._M_elems._104_5_ = 0;
    result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_3.m_backend.exp = 0;
    result_3.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_3.m_backend,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend,
               &uppersol.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&upperObj.m_backend,&result_3.m_backend);
    result_3.m_backend.fpclass = cpp_dec_float_finite;
    result_3.m_backend.prec_elem = 0x1c;
    result_3.m_backend.data._M_elems[0] = 0;
    result_3.m_backend.data._M_elems[1] = 0;
    result_3.m_backend.data._M_elems[2] = 0;
    result_3.m_backend.data._M_elems[3] = 0;
    result_3.m_backend.data._M_elems[4] = 0;
    result_3.m_backend.data._M_elems[5] = 0;
    result_3.m_backend.data._M_elems[6] = 0;
    result_3.m_backend.data._M_elems[7] = 0;
    result_3.m_backend.data._M_elems[8] = 0;
    result_3.m_backend.data._M_elems[9] = 0;
    result_3.m_backend.data._M_elems[10] = 0;
    result_3.m_backend.data._M_elems[0xb] = 0;
    result_3.m_backend.data._M_elems[0xc] = 0;
    result_3.m_backend.data._M_elems[0xd] = 0;
    result_3.m_backend.data._M_elems[0xe] = 0;
    result_3.m_backend.data._M_elems[0xf] = 0;
    result_3.m_backend.data._M_elems[0x10] = 0;
    result_3.m_backend.data._M_elems[0x11] = 0;
    result_3.m_backend.data._M_elems[0x12] = 0;
    result_3.m_backend.data._M_elems[0x13] = 0;
    result_3.m_backend.data._M_elems[0x14] = 0;
    result_3.m_backend.data._M_elems[0x15] = 0;
    result_3.m_backend.data._M_elems[0x16] = 0;
    result_3.m_backend.data._M_elems[0x17] = 0;
    result_3.m_backend.data._M_elems[0x18] = 0;
    result_3.m_backend.data._M_elems[0x19] = 0;
    result_3.m_backend.data._M_elems._104_5_ = 0;
    result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_3.m_backend.exp = 0;
    result_3.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_3.m_backend,
               &(lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).object.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend,
               &locksol.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].m_backend);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&lockObj.m_backend,&result_3.m_backend);
  } while( true );
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}